

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void vm_init(VM *vm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *ppvVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  *this;
  key_type local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",""
            );
  this = &vm->overrides;
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_add;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",""
            );
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_sub;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",""
            );
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_mul;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",""
            );
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_div;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",
             "");
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_lt;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",
             "");
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = x86_gt;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\print\\(global\\int\\\\)","");
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = print;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"global\\print\\(global\\bool\\\\)","");
  ppvVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this,&local_30);
  *ppvVar2 = print_bool;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void vm_init(VM* vm) {
  vm->addOverride("global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_add);
  vm->addOverride("global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_sub);
  vm->addOverride("global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_mul);
  vm->addOverride("global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_div);
  vm->addOverride("global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_lt);
  vm->addOverride("global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_gt);
  vm->addOverride("global\\print\\(global\\int\\\\)",(void*)&print);
  vm->addOverride("global\\print\\(global\\bool\\\\)",(void*)&print_bool);
  
}